

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O2

void QMetaType::registerNormalizedTypedef(QByteArray *normalizedTypeName,QMetaType metaType)

{
  Type *pTVar1;
  QMetaTypeInterface **ppQVar2;
  long in_FS_OFFSET;
  QWriteLocker local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (metaType.d_ptr != (QMetaTypeInterface *)0x0) {
    pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
             ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
                           *)normalizedTypeName);
    if (pTVar1 != (Type *)0x0) {
      local_28.q_val = (quintptr)pTVar1;
      QWriteLocker::relock(&local_28);
      ppQVar2 = QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>::operator[]
                          (&pTVar1->aliases,normalizedTypeName);
      if (*ppQVar2 == (QMetaTypeInterface *)0x0) {
        *ppQVar2 = metaType.d_ptr;
      }
      QWriteLocker::~QWriteLocker(&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMetaType::registerNormalizedTypedef(const NS(QByteArray) & normalizedTypeName,
                                          QMetaType metaType)
{
    if (!metaType.isValid())
        return;
    if (auto reg = customTypeRegistry()) {
        QWriteLocker lock(&reg->lock);
        auto &al = reg->aliases[normalizedTypeName];
        if (al)
            return;
        al = metaType.d_ptr;
    }
}